

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O3

void __thiscall Debugger::ExecuteWithSkipHook(Debugger *this,Executor *exec)

{
  bool bVar1;
  lua_State *local_18;
  
  bVar1 = this->skipHook;
  this->skipHook = true;
  local_18 = this->currentL;
  if ((exec->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*exec->_M_invoker)((_Any_data *)exec,&local_18);
    this->skipHook = bVar1;
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void Debugger::ExecuteWithSkipHook(const Executor &exec) {
	const bool skip = skipHook;
	skipHook = true;
	exec(currentL);
	skipHook = skip;
}